

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t dmrC_value_pseudo(dmr_C *C,symbol *type,longlong val)

{
  pseudo_list **list_00;
  uint local_64;
  undefined1 local_60 [8];
  ptr_list_iter pseudoiter__;
  pseudo_t pseudo;
  int size;
  pseudo_list **list;
  int hash;
  longlong val_local;
  symbol *type_local;
  dmr_C *C_local;
  
  list_00 = C->L->prev + (int)((uint)val & 0x3f);
  if (type == (symbol *)0x0) {
    local_64 = dmrC_value_size(val);
  }
  else {
    local_64 = (type->field_14).field_1.normal;
  }
  if ((local_64 != 0xffffffff) && (0x40 < (int)local_64)) {
    __assert_fail("size == -1 || size <= (int)(sizeof(long long) * 8)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                  ,0x34b,"pseudo_t dmrC_value_pseudo(struct dmr_C *, struct symbol *, long long)");
  }
  ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)*list_00);
  pseudoiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_60);
  while( true ) {
    if (pseudoiter__._16_8_ == 0) {
      pseudoiter__._16_8_ = dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
      ((pseudo_t)pseudoiter__._16_8_)->type = PSEUDO_VAL;
      (((pseudo_t)pseudoiter__._16_8_)->field_5).value = val;
      ((pseudo_t)pseudoiter__._16_8_)->size = local_64;
      dmrC_add_pseudo(C,list_00,(pseudo_t)pseudoiter__._16_8_);
      return (pseudo_t)pseudoiter__._16_8_;
    }
    if ((*(long *)(pseudoiter__._16_8_ + 0x20) == val) &&
       (*(uint *)(pseudoiter__._16_8_ + 8) == local_64)) break;
    pseudoiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_60);
  }
  return (pseudo_t)pseudoiter__._16_8_;
}

Assistant:

pseudo_t dmrC_value_pseudo(struct dmr_C *C, struct symbol *type, long long val)
{
	int hash = val & (MAX_VAL_HASH-1);
	struct pseudo_list **list = C->L->prev + hash;
	int size = type ? type->bit_size : dmrC_value_size(val);
	pseudo_t pseudo;

	assert(size == -1 || size <= (int)(sizeof(long long) * 8));

	FOR_EACH_PTR(*list, pseudo) {
		if (pseudo->value == val && pseudo->size == size)
			return pseudo;
	} END_FOR_EACH_PTR(pseudo);

	pseudo = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator, 0);
	pseudo->type = PSEUDO_VAL;
	pseudo->value = val;
	pseudo->size = size;
	dmrC_add_pseudo(C, list, pseudo);

	/* Value pseudos have neither nr, usage nor def */
	return pseudo;
}